

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::GenerateHeader
          (FileGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  FileDescriptor *pFVar3;
  undefined8 uVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int i;
  long lVar5;
  pointer ppMVar6;
  pointer ppEVar7;
  pointer ppEVar8;
  string header_extension;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fwd_decls;
  string local_128;
  ImportWriter local_108;
  
  paVar1 = &local_108.generate_for_named_framework_.field_2;
  local_108.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"GPBProtocolBuffers.h","");
  PrintFileRuntimePreamble(this,printer,&local_108.generate_for_named_framework_);
  i = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.generate_for_named_framework_._M_dataplus._M_p,
                    local_108.generate_for_named_framework_.field_2._M_allocated_capacity + 1);
    i = extraout_EDX_00;
  }
  SimpleItoa_abi_cxx11_(&local_108.generate_for_named_framework_,(protobuf *)0x7532,i);
  io::Printer::Print(printer,
                     "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n\n"
                     ,"google_protobuf_objc_version",&local_108.generate_for_named_framework_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.generate_for_named_framework_._M_dataplus._M_p,
                    local_108.generate_for_named_framework_.field_2._M_allocated_capacity + 1);
  }
  ImportWriter::ImportWriter
            (&local_108,&(this->options_).generate_for_named_framework,
             &(this->options_).named_framework_to_proto_path_mappings_path);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,".pbobjc.h","");
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x38)) {
    lVar5 = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,*(int *)(*(long *)(pFVar3 + 0x40) + lVar5 * 4));
      ImportWriter::AddFile(&local_108,pFVar3,&local_128);
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
    } while (lVar5 < *(int *)(pFVar3 + 0x38));
  }
  ImportWriter::Print(&local_108,printer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  ImportWriter::~ImportWriter(&local_108);
  io::Printer::Print(printer,
                     "// @@protoc_insertion_point(imports)\n\n#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n\nCF_EXTERN_C_BEGIN\n\n"
                    );
  psVar2 = &local_108.generate_for_named_framework_._M_string_length;
  local_108.generate_for_named_framework_._M_string_length._0_4_ = 0;
  local_108.generate_for_named_framework_.field_2._M_allocated_capacity = 0;
  local_108.named_framework_to_proto_path_mappings_path_._M_string_length = 0;
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = psVar2;
  local_108.generate_for_named_framework_.field_2._8_8_ = psVar2;
  local_108.named_framework_to_proto_path_mappings_path_._M_dataplus._M_p = (pointer)psVar2;
  if (ppMVar6 !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      MessageGenerator::DetermineForwardDeclarations
                (*ppMVar6,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_108);
      ppMVar6 = ppMVar6 + 1;
      uVar4 = local_108.generate_for_named_framework_.field_2._8_8_;
    } while (ppMVar6 !=
             (this->message_generators_).
             super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  for (; (size_type *)uVar4 != psVar2; uVar4 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar4))
  {
    io::Printer::Print(printer,"$value$;\n","value",(string *)(uVar4 + 0x20));
  }
  if ((size_type *)local_108.generate_for_named_framework_.field_2._8_8_ != psVar2) {
    io::Printer::Print(printer,"\n");
  }
  io::Printer::Print(printer,"NS_ASSUME_NONNULL_BEGIN\n\n");
  for (ppEVar7 = (this->enum_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar7 !=
      (this->enum_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
    EnumGenerator::GenerateHeader(*ppEVar7,printer);
  }
  for (ppMVar6 = (this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar6 !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar6 = ppMVar6 + 1) {
    MessageGenerator::GenerateEnumHeader(*ppMVar6,printer);
  }
  io::Printer::Print(printer,
                     "#pragma mark - $root_class_name$\n\n/**\n * Exposes the extension registry for this file.\n *\n * The base class provides:\n * @code\n *   + (GPBExtensionRegistry *)extensionRegistry;\n * @endcode\n * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n * this file and all files that it depends on.\n **/\n@interface $root_class_name$ : GPBRootObject\n@end\n\n"
                     ,"root_class_name",&this->root_class_name_);
  if ((this->extension_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->extension_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::Printer::Print(printer,"@interface $root_class_name$ (DynamicMethods)\n","root_class_name",
                       &this->root_class_name_);
    for (ppEVar8 = (this->extension_generators_).
                   super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar8 !=
        (this->extension_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppEVar8 = ppEVar8 + 1) {
      ExtensionGenerator::GenerateMembersHeader(*ppEVar8,printer);
    }
    io::Printer::Print(printer,"@end\n\n");
  }
  for (ppMVar6 = (this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar6 !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar6 = ppMVar6 + 1) {
    MessageGenerator::GenerateMessageHeader(*ppMVar6,printer);
  }
  io::Printer::Print(printer,
                     "NS_ASSUME_NONNULL_END\n\nCF_EXTERN_C_END\n\n#pragma clang diagnostic pop\n\n// @@protoc_insertion_point(global_scope)\n"
                    );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer *printer) {
  PrintFileRuntimePreamble(printer, "GPBProtocolBuffers.h");

  // Add some verification that the generated code matches the source the
  // code is being compiled with.
  // NOTE: This captures the raw numeric values at the time the generator was
  // compiled, since that will be the versions for the ObjC runtime at that
  // time.  The constants in the generated code will then get their values at
  // at compile time (so checking against the headers being used to compile).
  printer->Print(
      "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n"
      "#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n"
      "#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "\n",
      "google_protobuf_objc_version", SimpleItoa(GOOGLE_PROTOBUF_OBJC_VERSION));

  // #import any headers for "public imports" in the proto file.
  {
    ImportWriter import_writer(
        options_.generate_for_named_framework,
        options_.named_framework_to_proto_path_mappings_path);
    const string header_extension(kHeaderExtension);
    for (int i = 0; i < file_->public_dependency_count(); i++) {
      import_writer.AddFile(file_->public_dependency(i), header_extension);
    }
    import_writer.Print(printer);
  }

  // Note:
  //  deprecated-declarations suppression is only needed if some place in this
  //    proto file is something deprecated or if it references something from
  //    another file that is deprecated.
  printer->Print(
      "// @@protoc_insertion_point(imports)\n"
      "\n"
      "#pragma clang diagnostic push\n"
      "#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n"
      "\n"
      "CF_EXTERN_C_BEGIN\n"
      "\n");

  set<string> fwd_decls;
  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->DetermineForwardDeclarations(&fwd_decls);
  }
  for (set<string>::const_iterator i(fwd_decls.begin());
       i != fwd_decls.end(); ++i) {
    printer->Print("$value$;\n", "value", *i);
  }
  if (fwd_decls.begin() != fwd_decls.end()) {
    printer->Print("\n");
  }

  printer->Print(
      "NS_ASSUME_NONNULL_BEGIN\n"
      "\n");

  // need to write out all enums first
  for (vector<EnumGenerator *>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateHeader(printer);
  }

  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->GenerateEnumHeader(printer);
  }

  // For extensions to chain together, the Root gets created even if there
  // are no extensions.
  printer->Print(
      "#pragma mark - $root_class_name$\n"
      "\n"
      "/**\n"
      " * Exposes the extension registry for this file.\n"
      " *\n"
      " * The base class provides:\n"
      " * @code\n"
      " *   + (GPBExtensionRegistry *)extensionRegistry;\n"
      " * @endcode\n"
      " * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n"
      " * this file and all files that it depends on.\n"
      " **/\n"
      "@interface $root_class_name$ : GPBRootObject\n"
      "@end\n"
      "\n",
      "root_class_name", root_class_name_);

  if (extension_generators_.size() > 0) {
    // The dynamic methods block is only needed if there are extensions.
    printer->Print(
        "@interface $root_class_name$ (DynamicMethods)\n",
        "root_class_name", root_class_name_);

    for (vector<ExtensionGenerator *>::iterator iter =
             extension_generators_.begin();
         iter != extension_generators_.end(); ++iter) {
      (*iter)->GenerateMembersHeader(printer);
    }

    printer->Print("@end\n\n");
  }  // extension_generators_.size() > 0

  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->GenerateMessageHeader(printer);
  }

  printer->Print(
      "NS_ASSUME_NONNULL_END\n"
      "\n"
      "CF_EXTERN_C_END\n"
      "\n"
      "#pragma clang diagnostic pop\n"
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}